

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O2

void __thiscall IGameController::DoTeamBalance(IGameController *this)

{
  long lVar1;
  IConsole *pIVar2;
  CGameContext *pCVar3;
  IServer *pIVar4;
  CPlayer *pCVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int i_1;
  ulong uVar10;
  CPlayer *pCVar11;
  int i;
  uint uVar12;
  long lVar13;
  uint uVar14;
  long in_FS_OFFSET;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float aPlayerScore [64];
  float aTeamScore [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_GameFlags & 1) != 0) && (this->m_pConfig->m_SvTeambalanceTime != 0)) {
    uVar7 = this->m_aTeamSize[0] - this->m_aTeamSize[1];
    uVar14 = -uVar7;
    if (0 < (int)uVar7) {
      uVar14 = uVar7;
    }
    if (1 < uVar14) {
      pIVar2 = this->m_pGameServer->m_pConsole;
      (*(pIVar2->super_IInterface)._vptr_IInterface[0x19])(pIVar2,2,"game","Balancing teams",0);
      aTeamScore[0] = 0.0;
      aTeamScore[1] = 0.0;
      memset(aPlayerScore,0,0x100);
      pCVar3 = this->m_pGameServer;
      pIVar4 = this->m_pServer;
      for (lVar13 = 0; lVar13 != 0x40; lVar13 = lVar13 + 1) {
        pCVar11 = pCVar3->m_apPlayers[lVar13];
        if ((pCVar11 != (CPlayer *)0x0) && (lVar9 = (long)pCVar11->m_Team, lVar9 != -1)) {
          fVar16 = ((float)(pIVar4->m_TickSpeed * pCVar11->m_Score) * 60.0) /
                   (float)(pIVar4->m_CurrentGameTick - pCVar11->m_ScoreStartTick);
          aPlayerScore[lVar13] = fVar16;
          aTeamScore[lVar9] = fVar16 + aTeamScore[lVar9];
        }
      }
      uVar7 = this->m_aTeamSize[0] - this->m_aTeamSize[1];
      bVar6 = uVar7 == 0 || this->m_aTeamSize[0] < this->m_aTeamSize[1];
      uVar14 = -uVar7;
      if (0 < (int)uVar7) {
        uVar14 = uVar7;
      }
      uVar14 = uVar14 >> 1;
      fVar16 = aTeamScore[bVar6];
      uVar12 = (uint)bVar6;
      uVar7 = uVar12 ^ 1;
      do {
        pCVar11 = (CPlayer *)0x0;
        fVar19 = fVar16;
        for (uVar10 = 0; uVar10 != 0x40; uVar10 = uVar10 + 1) {
          if (this->m_pGameServer->m_apPlayers[uVar10] != (CPlayer *)0x0) {
            iVar8 = (**this->_vptr_IGameController)(this,uVar10 & 0xffffffff);
            if (((char)iVar8 != '\0') &&
               (pCVar5 = this->m_pGameServer->m_apPlayers[uVar10], pCVar5->m_Team == uVar12)) {
              fVar15 = (aTeamScore[uVar7] + aPlayerScore[uVar10]) - (fVar16 - aPlayerScore[uVar10]);
              fVar17 = -fVar15;
              if (pCVar11 != (CPlayer *)0x0) {
                fVar18 = fVar17;
                if (fVar17 <= fVar15) {
                  fVar18 = fVar15;
                }
                if (fVar19 <= fVar18) goto LAB_00119d85;
              }
              fVar19 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar15 |
                              (uint)fVar17 & -(uint)(fVar15 < 0.0));
              pCVar11 = pCVar5;
            }
          }
LAB_00119d85:
        }
        if (pCVar11 != (CPlayer *)0x0) {
          iVar8 = pCVar11->m_LastActionTick;
          DoTeamChange(this,pCVar11,uVar7,true);
          pCVar11->m_LastActionTick = iVar8;
          CPlayer::Respawn(pCVar11);
          CGameContext::SendGameMsg(this->m_pGameServer,7,pCVar11->m_Team,pCVar11->m_ClientID);
        }
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
      this->m_UnbalancedTick = -1;
      CGameContext::SendGameMsg(this->m_pGameServer,3,-1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IGameController::DoTeamBalance()
{
	if(!IsTeamplay() || !Config()->m_SvTeambalanceTime || absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) < NUM_TEAMS)
		return;

	GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", "Balancing teams");

	float aTeamScore[NUM_TEAMS] = {0};
	float aPlayerScore[MAX_CLIENTS] = {0.0f};

	// gather stats
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS)
		{
			aPlayerScore[i] = GameServer()->m_apPlayers[i]->m_Score*Server()->TickSpeed()*60.0f/
				(Server()->Tick()-GameServer()->m_apPlayers[i]->m_ScoreStartTick);
			aTeamScore[GameServer()->m_apPlayers[i]->GetTeam()] += aPlayerScore[i];
		}
	}

	int BiggerTeam = (m_aTeamSize[TEAM_RED] > m_aTeamSize[TEAM_BLUE]) ? TEAM_RED : TEAM_BLUE;
	int NumBalance = absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) / NUM_TEAMS;

	// balance teams
	do
	{
		CPlayer *pPlayer = 0;
		float ScoreDiff = aTeamScore[BiggerTeam];
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			if(!GameServer()->m_apPlayers[i] || !CanBeMovedOnBalance(i))
				continue;

			// remember the player whom would cause lowest score-difference
			if(GameServer()->m_apPlayers[i]->GetTeam() == BiggerTeam &&
				(!pPlayer || absolute((aTeamScore[BiggerTeam^1]+aPlayerScore[i]) - (aTeamScore[BiggerTeam]-aPlayerScore[i])) < ScoreDiff))
			{
				pPlayer = GameServer()->m_apPlayers[i];
				ScoreDiff = absolute((aTeamScore[BiggerTeam^1]+aPlayerScore[i]) - (aTeamScore[BiggerTeam]-aPlayerScore[i]));
			}
		}

		// move the player to the other team
		if(pPlayer)
		{
			int Temp = pPlayer->m_LastActionTick;
			DoTeamChange(pPlayer, BiggerTeam^1);
			pPlayer->m_LastActionTick = Temp;
			pPlayer->Respawn();
			GameServer()->SendGameMsg(GAMEMSG_TEAM_BALANCE_VICTIM, pPlayer->GetTeam(), pPlayer->GetCID());
		}
	}
	while(--NumBalance);

	m_UnbalancedTick = TBALANCE_OK;
	GameServer()->SendGameMsg(GAMEMSG_TEAM_BALANCE, -1);
}